

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

void * flatcc_builder_copy_buffer(flatcc_builder_t *B,void *buffer,size_t size)

{
  void *pvVar1;
  
  if (B->is_default_emitter == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = flatcc_emitter_copy_buffer(&B->default_emit_context,buffer,size);
    if (pvVar1 == (void *)0x0) {
      __assert_fail("buffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x7ab,"void *flatcc_builder_copy_buffer(flatcc_builder_t *, void *, size_t)");
    }
  }
  return pvVar1;
}

Assistant:

void *flatcc_builder_copy_buffer(flatcc_builder_t *B, void *buffer, size_t size)
{
    /* User is allowed to call tentatively to see if there is support. */
    if (!B->is_default_emitter) {
        return 0;
    }
    buffer = flatcc_emitter_copy_buffer(&B->default_emit_context, buffer, size);
    check(buffer, "default emitter declined to copy buffer");
    return buffer;
}